

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  int iVar68;
  int32_t *piVar69;
  undefined8 *puVar70;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  undefined1 auVar109 [16];
  int col;
  __m128i y;
  __m128i x;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u7;
  __m128i u6;
  __m128i u5;
  __m128i u4;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i zero;
  __m128i rnding;
  __m128i cospi12;
  __m128i cospim52;
  __m128i cospi52;
  __m128i cospim36;
  __m128i cospi36;
  __m128i cospi28;
  __m128i cospi44;
  __m128i cospim20;
  __m128i cospi20;
  __m128i cospi60;
  __m128i cospim4;
  __m128i cospi4;
  __m128i cospim48;
  __m128i cospi48;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospi32;
  int32_t *cospi;
  int local_111c;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1008;
  undefined8 uStack_1000;
  char local_ebc;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d48;
  int iStack_d44;
  int iStack_d40;
  int iStack_d3c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c08;
  int iStack_c04;
  int iStack_c00;
  int iStack_bfc;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bc8;
  int iStack_bc4;
  int iStack_bc0;
  int iStack_bbc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b88;
  int iStack_b84;
  int iStack_b80;
  int iStack_b7c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b48;
  int iStack_b44;
  int iStack_b40;
  int iStack_b3c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a68;
  int iStack_a64;
  int iStack_a60;
  int iStack_a5c;
  int local_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int local_a08;
  int iStack_a04;
  int iStack_a00;
  int iStack_9fc;
  int local_9f8;
  int iStack_9f4;
  int iStack_9f0;
  int iStack_9ec;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  
  piVar69 = cospi_arr(in_EDX);
  iVar1 = piVar69[0x20];
  uVar62 = CONCAT44(iVar1,iVar1);
  uVar63 = CONCAT44(iVar1,iVar1);
  iVar1 = piVar69[0x10];
  uVar64 = CONCAT44(iVar1,iVar1);
  uVar65 = CONCAT44(iVar1,iVar1);
  iVar68 = -piVar69[0x10];
  auVar48._4_4_ = iVar68;
  auVar48._0_4_ = iVar68;
  auVar48._12_4_ = iVar68;
  auVar48._8_4_ = iVar68;
  iVar1 = piVar69[0x30];
  uVar66 = CONCAT44(iVar1,iVar1);
  uVar67 = CONCAT44(iVar1,iVar1);
  iVar68 = -piVar69[0x30];
  auVar46._4_4_ = iVar68;
  auVar46._0_4_ = iVar68;
  auVar46._12_4_ = iVar68;
  auVar46._8_4_ = iVar68;
  iVar1 = piVar69[4];
  auVar38._4_4_ = iVar1;
  auVar38._0_4_ = iVar1;
  auVar38._12_4_ = iVar1;
  auVar38._8_4_ = iVar1;
  iVar68 = -piVar69[4];
  auVar32._4_4_ = iVar68;
  auVar32._0_4_ = iVar68;
  auVar32._12_4_ = iVar68;
  auVar32._8_4_ = iVar68;
  iVar1 = piVar69[0x3c];
  iVar2 = piVar69[0x14];
  auVar30._4_4_ = iVar2;
  auVar30._0_4_ = iVar2;
  auVar30._12_4_ = iVar2;
  auVar30._8_4_ = iVar2;
  iVar68 = -piVar69[0x14];
  auVar24._4_4_ = iVar68;
  auVar24._0_4_ = iVar68;
  auVar24._12_4_ = iVar68;
  auVar24._8_4_ = iVar68;
  iVar2 = piVar69[0x2c];
  iVar3 = piVar69[0x1c];
  iVar4 = piVar69[0x24];
  auVar22._4_4_ = iVar4;
  auVar22._0_4_ = iVar4;
  auVar22._12_4_ = iVar4;
  auVar22._8_4_ = iVar4;
  iVar68 = -piVar69[0x24];
  auVar16._4_4_ = iVar68;
  auVar16._0_4_ = iVar68;
  auVar16._12_4_ = iVar68;
  auVar16._8_4_ = iVar68;
  iVar4 = piVar69[0x34];
  auVar14._4_4_ = iVar4;
  auVar14._0_4_ = iVar4;
  auVar14._12_4_ = iVar4;
  auVar14._8_4_ = iVar4;
  iVar68 = -piVar69[0x34];
  auVar11._4_4_ = iVar68;
  auVar11._0_4_ = iVar68;
  auVar11._12_4_ = iVar68;
  auVar11._8_4_ = iVar68;
  iVar4 = piVar69[0xc];
  local_ebc = (char)in_EDX;
  iVar68 = 1 << (local_ebc - 1U & 0x1f);
  for (local_111c = 0; local_111c < in_ECX; local_111c = local_111c + 1) {
    puVar70 = (undefined8 *)(in_RDI + (long)local_111c * 0x10);
    uVar5 = *puVar70;
    uVar6 = puVar70[1];
    puVar70 = (undefined8 *)(in_RDI + (long)(in_ECX * 7 + local_111c) * 0x10);
    uVar7 = *puVar70;
    uVar8 = puVar70[1];
    local_848 = (int)uVar7;
    iStack_844 = (int)((ulong)uVar7 >> 0x20);
    iStack_840 = (int)uVar8;
    iStack_83c = (int)((ulong)uVar8 >> 0x20);
    puVar70 = (undefined8 *)(in_RDI + (long)(in_ECX * 3 + local_111c) * 0x10);
    uVar7 = *puVar70;
    uVar8 = puVar70[1];
    local_868 = (int)uVar7;
    iStack_864 = (int)((ulong)uVar7 >> 0x20);
    iStack_860 = (int)uVar8;
    iStack_85c = (int)((ulong)uVar8 >> 0x20);
    puVar70 = (undefined8 *)(in_RDI + (long)(in_ECX + local_111c) * 0x10);
    uVar7 = *puVar70;
    uVar8 = puVar70[1];
    local_888 = (int)uVar7;
    iStack_884 = (int)((ulong)uVar7 >> 0x20);
    iStack_880 = (int)uVar8;
    iStack_87c = (int)((ulong)uVar8 >> 0x20);
    puVar70 = (undefined8 *)(in_RDI + (long)(in_ECX * 6 + local_111c) * 0x10);
    uVar7 = *puVar70;
    uVar8 = puVar70[1];
    puVar70 = (undefined8 *)(in_RDI + (long)(in_ECX * 5 + local_111c) * 0x10);
    uVar9 = *puVar70;
    uVar10 = puVar70[1];
    local_8a8 = (int)uVar9;
    iStack_8a4 = (int)((ulong)uVar9 >> 0x20);
    iStack_8a0 = (int)uVar10;
    iStack_89c = (int)((ulong)uVar10 >> 0x20);
    auVar61._4_4_ = -iStack_864;
    auVar61._0_4_ = -local_868;
    auVar61._12_4_ = -iStack_85c;
    auVar61._8_4_ = -iStack_860;
    auVar60._8_8_ = uVar63;
    auVar60._0_8_ = uVar62;
    auVar77 = pmulld(auVar61,auVar60);
    auVar59._8_8_ = uVar63;
    auVar59._0_8_ = uVar62;
    auVar78 = pmulld(*(undefined1 (*) [16])(in_RDI + (long)(in_ECX * 4 + local_111c) * 0x10),auVar59
                    );
    local_9f8 = auVar77._0_4_;
    iStack_9f4 = auVar77._4_4_;
    iStack_9f0 = auVar77._8_4_;
    iStack_9ec = auVar77._12_4_;
    local_a08 = auVar78._0_4_;
    iStack_a04 = auVar78._4_4_;
    iStack_a00 = auVar78._8_4_;
    iStack_9fc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar71 = local_9f8 + local_a08 + iVar68 >> auVar77;
    iVar79 = iStack_9f4 + iStack_a04 + iVar68 >> auVar77;
    iVar85 = iStack_9f0 + iStack_a00 + iVar68 >> auVar77;
    iVar96 = iStack_9ec + iStack_9fc + iVar68 >> auVar77;
    auVar77 = ZEXT416(in_EDX);
    iVar72 = (local_9f8 - local_a08) + iVar68 >> auVar77;
    iVar80 = (iStack_9f4 - iStack_a04) + iVar68 >> auVar77;
    iVar86 = (iStack_9f0 - iStack_a00) + iVar68 >> auVar77;
    iVar97 = (iStack_9ec - iStack_9fc) + iVar68 >> auVar77;
    auVar58._8_8_ = uVar63;
    auVar58._0_8_ = uVar62;
    auVar77 = pmulld(*(undefined1 (*) [16])(in_RDI + (long)(in_ECX * 2 + local_111c) * 0x10),auVar58
                    );
    auVar57._4_4_ = -iStack_8a4;
    auVar57._0_4_ = -local_8a8;
    auVar57._12_4_ = -iStack_89c;
    auVar57._8_4_ = -iStack_8a0;
    auVar56._8_8_ = uVar63;
    auVar56._0_8_ = uVar62;
    auVar78 = pmulld(auVar57,auVar56);
    local_a58 = auVar77._0_4_;
    iStack_a54 = auVar77._4_4_;
    iStack_a50 = auVar77._8_4_;
    iStack_a4c = auVar77._12_4_;
    local_a68 = auVar78._0_4_;
    iStack_a64 = auVar78._4_4_;
    iStack_a60 = auVar78._8_4_;
    iStack_a5c = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar73 = local_a58 + local_a68 + iVar68 >> auVar77;
    iVar81 = iStack_a54 + iStack_a64 + iVar68 >> auVar77;
    iVar87 = iStack_a50 + iStack_a60 + iVar68 >> auVar77;
    iVar98 = iStack_a4c + iStack_a5c + iVar68 >> auVar77;
    auVar77 = ZEXT416(in_EDX);
    iVar74 = (local_a58 - local_a68) + iVar68 >> auVar77;
    iVar82 = (iStack_a54 - iStack_a64) + iVar68 >> auVar77;
    iVar88 = (iStack_a50 - iStack_a60) + iVar68 >> auVar77;
    iVar99 = (iStack_a4c - iStack_a5c) + iVar68 >> auVar77;
    local_ab8 = (int)uVar5;
    iStack_ab4 = (int)((ulong)uVar5 >> 0x20);
    iStack_ab0 = (int)uVar6;
    iStack_aac = (int)((ulong)uVar6 >> 0x20);
    iVar75 = local_ab8 + iVar71;
    iVar83 = iStack_ab4 + iVar79;
    iVar89 = iStack_ab0 + iVar85;
    iVar100 = iStack_aac + iVar96;
    iVar76 = -local_848 + iVar72;
    iVar84 = -iStack_844 + iVar80;
    iVar90 = -iStack_840 + iVar86;
    iVar101 = -iStack_83c + iVar97;
    local_ab8 = local_ab8 - iVar71;
    iStack_ab4 = iStack_ab4 - iVar79;
    iStack_ab0 = iStack_ab0 - iVar85;
    iStack_aac = iStack_aac - iVar96;
    iVar72 = -local_848 - iVar72;
    iVar80 = -iStack_844 - iVar80;
    iVar86 = -iStack_840 - iVar86;
    iVar97 = -iStack_83c - iVar97;
    iVar71 = -local_888 + iVar73;
    iVar79 = -iStack_884 + iVar81;
    iVar96 = -iStack_880 + iVar87;
    iVar102 = -iStack_87c + iVar98;
    local_b18 = (int)uVar7;
    iStack_b14 = (int)((ulong)uVar7 >> 0x20);
    iStack_b10 = (int)uVar8;
    iStack_b0c = (int)((ulong)uVar8 >> 0x20);
    local_1058 = CONCAT44(iStack_b14 + iVar82,local_b18 + iVar74);
    uStack_1050 = CONCAT44(iStack_b0c + iVar99,iStack_b10 + iVar88);
    local_1068 = CONCAT44(-iStack_884 - iVar81,-local_888 - iVar73);
    uStack_1060 = CONCAT44(-iStack_87c - iVar98,-iStack_880 - iVar87);
    local_b18 = local_b18 - iVar74;
    iStack_b14 = iStack_b14 - iVar82;
    iStack_b10 = iStack_b10 - iVar88;
    iStack_b0c = iStack_b0c - iVar99;
    auVar55._4_4_ = iVar79;
    auVar55._0_4_ = iVar71;
    auVar55._12_4_ = iVar102;
    auVar55._8_4_ = iVar96;
    auVar54._8_8_ = uVar65;
    auVar54._0_8_ = uVar64;
    auVar77 = pmulld(auVar55,auVar54);
    auVar53._8_8_ = uStack_1050;
    auVar53._0_8_ = local_1058;
    auVar52._8_8_ = uVar67;
    auVar52._0_8_ = uVar66;
    auVar78 = pmulld(auVar53,auVar52);
    local_b38 = auVar77._0_4_;
    iStack_b34 = auVar77._4_4_;
    iStack_b30 = auVar77._8_4_;
    iStack_b2c = auVar77._12_4_;
    local_b48 = auVar78._0_4_;
    iStack_b44 = auVar78._4_4_;
    iStack_b40 = auVar78._8_4_;
    iStack_b3c = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar73 = local_b38 + local_b48 + iVar68 >> auVar77;
    iVar85 = iStack_b34 + iStack_b44 + iVar68 >> auVar77;
    iVar91 = iStack_b30 + iStack_b40 + iVar68 >> auVar77;
    iVar103 = iStack_b2c + iStack_b3c + iVar68 >> auVar77;
    auVar51._4_4_ = iVar79;
    auVar51._0_4_ = iVar71;
    auVar51._12_4_ = iVar102;
    auVar51._8_4_ = iVar96;
    auVar50._8_8_ = uVar67;
    auVar50._0_8_ = uVar66;
    auVar77 = pmulld(auVar51,auVar50);
    auVar49._8_8_ = uStack_1050;
    auVar49._0_8_ = local_1058;
    auVar78 = pmulld(auVar49,auVar48);
    local_b78 = auVar77._0_4_;
    iStack_b74 = auVar77._4_4_;
    iStack_b70 = auVar77._8_4_;
    iStack_b6c = auVar77._12_4_;
    local_b88 = auVar78._0_4_;
    iStack_b84 = auVar78._4_4_;
    iStack_b80 = auVar78._8_4_;
    iStack_b7c = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar71 = local_b78 + local_b88 + iVar68 >> auVar77;
    iVar87 = iStack_b74 + iStack_b84 + iVar68 >> auVar77;
    iVar102 = iStack_b70 + iStack_b80 + iVar68 >> auVar77;
    iVar104 = iStack_b6c + iStack_b7c + iVar68 >> auVar77;
    auVar47._8_8_ = uStack_1060;
    auVar47._0_8_ = local_1068;
    auVar77 = pmulld(auVar47,auVar46);
    auVar45._4_4_ = iStack_b14;
    auVar45._0_4_ = local_b18;
    auVar45._12_4_ = iStack_b0c;
    auVar45._8_4_ = iStack_b10;
    auVar44._8_8_ = uVar65;
    auVar44._0_8_ = uVar64;
    auVar78 = pmulld(auVar45,auVar44);
    local_bb8 = auVar77._0_4_;
    iStack_bb4 = auVar77._4_4_;
    iStack_bb0 = auVar77._8_4_;
    iStack_bac = auVar77._12_4_;
    local_bc8 = auVar78._0_4_;
    iStack_bc4 = auVar78._4_4_;
    iStack_bc0 = auVar78._8_4_;
    iStack_bbc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar74 = local_bb8 + local_bc8 + iVar68 >> auVar77;
    iVar88 = iStack_bb4 + iStack_bc4 + iVar68 >> auVar77;
    iVar92 = iStack_bb0 + iStack_bc0 + iVar68 >> auVar77;
    iVar105 = iStack_bac + iStack_bbc + iVar68 >> auVar77;
    auVar43._8_8_ = uStack_1060;
    auVar43._0_8_ = local_1068;
    auVar42._8_8_ = uVar65;
    auVar42._0_8_ = uVar64;
    auVar77 = pmulld(auVar43,auVar42);
    auVar41._4_4_ = iStack_b14;
    auVar41._0_4_ = local_b18;
    auVar41._12_4_ = iStack_b0c;
    auVar41._8_4_ = iStack_b10;
    auVar40._8_8_ = uVar67;
    auVar40._0_8_ = uVar66;
    auVar78 = pmulld(auVar41,auVar40);
    local_bf8 = auVar77._0_4_;
    iStack_bf4 = auVar77._4_4_;
    iStack_bf0 = auVar77._8_4_;
    iStack_bec = auVar77._12_4_;
    local_c08 = auVar78._0_4_;
    iStack_c04 = auVar78._4_4_;
    iStack_c00 = auVar78._8_4_;
    iStack_bfc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    iVar79 = local_bf8 + local_c08 + iVar68 >> auVar77;
    iVar96 = iStack_bf4 + iStack_c04 + iVar68 >> auVar77;
    iVar93 = iStack_bf0 + iStack_c00 + iVar68 >> auVar77;
    iVar106 = iStack_bec + iStack_bfc + iVar68 >> auVar77;
    local_1008 = CONCAT44(iVar83 + iVar85,iVar75 + iVar73);
    uStack_1000 = CONCAT44(iVar100 + iVar103,iVar89 + iVar91);
    iVar81 = iVar76 + iVar71;
    iVar98 = iVar84 + iVar87;
    iVar94 = iVar90 + iVar102;
    iVar107 = iVar101 + iVar104;
    iVar82 = local_ab8 + iVar74;
    iVar99 = iStack_ab4 + iVar88;
    iVar95 = iStack_ab0 + iVar92;
    iVar108 = iStack_aac + iVar105;
    local_1038 = CONCAT44(iVar80 + iVar96,iVar72 + iVar79);
    uStack_1030 = CONCAT44(iVar97 + iVar106,iVar86 + iVar93);
    iVar75 = iVar75 - iVar73;
    iVar83 = iVar83 - iVar85;
    iVar89 = iVar89 - iVar91;
    iVar100 = iVar100 - iVar103;
    local_1058 = CONCAT44(iVar84 - iVar87,iVar76 - iVar71);
    uStack_1050 = CONCAT44(iVar101 - iVar104,iVar90 - iVar102);
    local_1068 = CONCAT44(iStack_ab4 - iVar88,local_ab8 - iVar74);
    uStack_1060 = CONCAT44(iStack_aac - iVar105,iStack_ab0 - iVar92);
    iVar72 = iVar72 - iVar79;
    iVar80 = iVar80 - iVar96;
    iVar86 = iVar86 - iVar93;
    iVar97 = iVar97 - iVar106;
    auVar39._8_8_ = uStack_1000;
    auVar39._0_8_ = local_1008;
    auVar77 = pmulld(auVar39,auVar38);
    auVar37._4_4_ = iVar98;
    auVar37._0_4_ = iVar81;
    auVar37._12_4_ = iVar107;
    auVar37._8_4_ = iVar94;
    auVar36._8_8_ = CONCAT44(iVar1,iVar1);
    auVar36._0_8_ = CONCAT44(iVar1,iVar1);
    auVar78 = pmulld(auVar37,auVar36);
    local_cb8 = auVar77._0_4_;
    iStack_cb4 = auVar77._4_4_;
    iStack_cb0 = auVar77._8_4_;
    iStack_cac = auVar77._12_4_;
    local_cc8 = auVar78._0_4_;
    iStack_cc4 = auVar78._4_4_;
    iStack_cc0 = auVar78._8_4_;
    iStack_cbc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_1088 = CONCAT44(iStack_cb4 + iStack_cc4 + iVar68 >> auVar77,
                          local_cb8 + local_cc8 + iVar68 >> auVar77);
    uStack_1080 = CONCAT44(iStack_cac + iStack_cbc + iVar68 >> auVar77,
                           iStack_cb0 + iStack_cc0 + iVar68 >> auVar77);
    auVar35._8_8_ = uStack_1000;
    auVar35._0_8_ = local_1008;
    auVar34._8_8_ = CONCAT44(iVar1,iVar1);
    auVar34._0_8_ = CONCAT44(iVar1,iVar1);
    auVar77 = pmulld(auVar35,auVar34);
    auVar33._4_4_ = iVar98;
    auVar33._0_4_ = iVar81;
    auVar33._12_4_ = iVar107;
    auVar33._8_4_ = iVar94;
    auVar78 = pmulld(auVar33,auVar32);
    local_cf8 = auVar77._0_4_;
    iStack_cf4 = auVar77._4_4_;
    iStack_cf0 = auVar77._8_4_;
    iStack_cec = auVar77._12_4_;
    local_d08 = auVar78._0_4_;
    iStack_d04 = auVar78._4_4_;
    iStack_d00 = auVar78._8_4_;
    iStack_cfc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_1098 = CONCAT44(iStack_cf4 + iStack_d04 + iVar68 >> auVar77,
                          local_cf8 + local_d08 + iVar68 >> auVar77);
    uStack_1090 = CONCAT44(iStack_cec + iStack_cfc + iVar68 >> auVar77,
                           iStack_cf0 + iStack_d00 + iVar68 >> auVar77);
    auVar31._4_4_ = iVar99;
    auVar31._0_4_ = iVar82;
    auVar31._12_4_ = iVar108;
    auVar31._8_4_ = iVar95;
    auVar77 = pmulld(auVar31,auVar30);
    auVar29._8_8_ = uStack_1030;
    auVar29._0_8_ = local_1038;
    auVar28._8_8_ = CONCAT44(iVar2,iVar2);
    auVar28._0_8_ = CONCAT44(iVar2,iVar2);
    auVar78 = pmulld(auVar29,auVar28);
    local_d38 = auVar77._0_4_;
    iStack_d34 = auVar77._4_4_;
    iStack_d30 = auVar77._8_4_;
    iStack_d2c = auVar77._12_4_;
    local_d48 = auVar78._0_4_;
    iStack_d44 = auVar78._4_4_;
    iStack_d40 = auVar78._8_4_;
    iStack_d3c = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_10a8 = CONCAT44(iStack_d34 + iStack_d44 + iVar68 >> auVar77,
                          local_d38 + local_d48 + iVar68 >> auVar77);
    uStack_10a0 = CONCAT44(iStack_d2c + iStack_d3c + iVar68 >> auVar77,
                           iStack_d30 + iStack_d40 + iVar68 >> auVar77);
    auVar27._4_4_ = iVar99;
    auVar27._0_4_ = iVar82;
    auVar27._12_4_ = iVar108;
    auVar27._8_4_ = iVar95;
    auVar26._8_8_ = CONCAT44(iVar2,iVar2);
    auVar26._0_8_ = CONCAT44(iVar2,iVar2);
    auVar77 = pmulld(auVar27,auVar26);
    auVar25._8_8_ = uStack_1030;
    auVar25._0_8_ = local_1038;
    auVar78 = pmulld(auVar25,auVar24);
    local_d78 = auVar77._0_4_;
    iStack_d74 = auVar77._4_4_;
    iStack_d70 = auVar77._8_4_;
    iStack_d6c = auVar77._12_4_;
    local_d88 = auVar78._0_4_;
    iStack_d84 = auVar78._4_4_;
    iStack_d80 = auVar78._8_4_;
    iStack_d7c = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_10b8 = CONCAT44(iStack_d74 + iStack_d84 + iVar68 >> auVar77,
                          local_d78 + local_d88 + iVar68 >> auVar77);
    uStack_10b0 = CONCAT44(iStack_d6c + iStack_d7c + iVar68 >> auVar77,
                           iStack_d70 + iStack_d80 + iVar68 >> auVar77);
    auVar23._4_4_ = iVar83;
    auVar23._0_4_ = iVar75;
    auVar23._12_4_ = iVar100;
    auVar23._8_4_ = iVar89;
    auVar77 = pmulld(auVar23,auVar22);
    auVar21._8_8_ = uStack_1050;
    auVar21._0_8_ = local_1058;
    auVar20._8_8_ = CONCAT44(iVar3,iVar3);
    auVar20._0_8_ = CONCAT44(iVar3,iVar3);
    auVar78 = pmulld(auVar21,auVar20);
    local_db8 = auVar77._0_4_;
    iStack_db4 = auVar77._4_4_;
    iStack_db0 = auVar77._8_4_;
    iStack_dac = auVar77._12_4_;
    local_dc8 = auVar78._0_4_;
    iStack_dc4 = auVar78._4_4_;
    iStack_dc0 = auVar78._8_4_;
    iStack_dbc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_10c8 = CONCAT44(iStack_db4 + iStack_dc4 + iVar68 >> auVar77,
                          local_db8 + local_dc8 + iVar68 >> auVar77);
    uStack_10c0 = CONCAT44(iStack_dac + iStack_dbc + iVar68 >> auVar77,
                           iStack_db0 + iStack_dc0 + iVar68 >> auVar77);
    auVar19._4_4_ = iVar83;
    auVar19._0_4_ = iVar75;
    auVar19._12_4_ = iVar100;
    auVar19._8_4_ = iVar89;
    auVar18._8_8_ = CONCAT44(iVar3,iVar3);
    auVar18._0_8_ = CONCAT44(iVar3,iVar3);
    auVar77 = pmulld(auVar19,auVar18);
    auVar17._8_8_ = uStack_1050;
    auVar17._0_8_ = local_1058;
    auVar78 = pmulld(auVar17,auVar16);
    local_df8 = auVar77._0_4_;
    iStack_df4 = auVar77._4_4_;
    iStack_df0 = auVar77._8_4_;
    iStack_dec = auVar77._12_4_;
    local_e08 = auVar78._0_4_;
    iStack_e04 = auVar78._4_4_;
    iStack_e00 = auVar78._8_4_;
    iStack_dfc = auVar78._12_4_;
    auVar77 = ZEXT416(in_EDX);
    local_10d8 = CONCAT44(iStack_df4 + iStack_e04 + iVar68 >> auVar77,
                          local_df8 + local_e08 + iVar68 >> auVar77);
    uStack_10d0 = CONCAT44(iStack_dec + iStack_dfc + iVar68 >> auVar77,
                           iStack_df0 + iStack_e00 + iVar68 >> auVar77);
    auVar15._8_8_ = uStack_1060;
    auVar15._0_8_ = local_1068;
    auVar77 = pmulld(auVar15,auVar14);
    auVar13._4_4_ = iVar80;
    auVar13._0_4_ = iVar72;
    auVar13._12_4_ = iVar97;
    auVar13._8_4_ = iVar86;
    auVar109._8_8_ = CONCAT44(iVar4,iVar4);
    auVar109._0_8_ = CONCAT44(iVar4,iVar4);
    auVar78 = pmulld(auVar13,auVar109);
    local_e38 = auVar77._0_4_;
    iStack_e34 = auVar77._4_4_;
    iStack_e30 = auVar77._8_4_;
    iStack_e2c = auVar77._12_4_;
    local_e48 = auVar78._0_4_;
    iStack_e44 = auVar78._4_4_;
    iStack_e40 = auVar78._8_4_;
    iStack_e3c = auVar78._12_4_;
    auVar109 = ZEXT416(in_EDX);
    auVar12._8_8_ = uStack_1060;
    auVar12._0_8_ = local_1068;
    auVar78._8_8_ = CONCAT44(iVar4,iVar4);
    auVar78._0_8_ = CONCAT44(iVar4,iVar4);
    auVar78 = pmulld(auVar12,auVar78);
    auVar77._4_4_ = iVar80;
    auVar77._0_4_ = iVar72;
    auVar77._12_4_ = iVar97;
    auVar77._8_4_ = iVar86;
    auVar77 = pmulld(auVar77,auVar11);
    local_e78 = auVar78._0_4_;
    iStack_e74 = auVar78._4_4_;
    iStack_e70 = auVar78._8_4_;
    iStack_e6c = auVar78._12_4_;
    local_e88 = auVar77._0_4_;
    iStack_e84 = auVar77._4_4_;
    iStack_e80 = auVar77._8_4_;
    iStack_e7c = auVar77._12_4_;
    auVar77 = ZEXT416(in_EDX);
    puVar70 = (undefined8 *)(in_RSI + (long)local_111c * 0x10);
    *puVar70 = local_1098;
    puVar70[1] = uStack_1090;
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX + local_111c) * 0x10);
    *puVar70 = CONCAT44(iStack_e34 + iStack_e44 + iVar68 >> auVar109,
                        local_e38 + local_e48 + iVar68 >> auVar109);
    puVar70[1] = CONCAT44(iStack_e2c + iStack_e3c + iVar68 >> auVar109,
                          iStack_e30 + iStack_e40 + iVar68 >> auVar109);
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 2 + local_111c) * 0x10);
    *puVar70 = local_10b8;
    puVar70[1] = uStack_10b0;
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 3 + local_111c) * 0x10);
    *puVar70 = local_10c8;
    puVar70[1] = uStack_10c0;
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 4 + local_111c) * 0x10);
    *puVar70 = local_10d8;
    puVar70[1] = uStack_10d0;
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 5 + local_111c) * 0x10);
    *puVar70 = local_10a8;
    puVar70[1] = uStack_10a0;
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 6 + local_111c) * 0x10);
    *puVar70 = CONCAT44(iStack_e74 + iStack_e84 + iVar68 >> auVar77,
                        local_e78 + local_e88 + iVar68 >> auVar77);
    puVar70[1] = CONCAT44(iStack_e6c + iStack_e7c + iVar68 >> auVar77,
                          iStack_e70 + iStack_e80 + iVar68 >> auVar77);
    puVar70 = (undefined8 *)(in_RSI + (long)(in_ECX * 7 + local_111c) * 0x10);
    *puVar70 = local_1088;
    puVar70[1] = uStack_1080;
  }
  return;
}

Assistant:

static void fadst8x8_sse4_1(__m128i *in, __m128i *out, int bit,
                            const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u0 = in[col_num * 0 + col];
    u1 = _mm_sub_epi32(zero, in[col_num * 7 + col]);
    u2 = _mm_sub_epi32(zero, in[col_num * 3 + col]);
    u3 = in[col_num * 4 + col];
    u4 = _mm_sub_epi32(zero, in[col_num * 1 + col]);
    u5 = in[col_num * 6 + col];
    u6 = in[col_num * 2 + col];
    u7 = _mm_sub_epi32(zero, in[col_num * 5 + col]);

    // stage 2
    v0 = u0;
    v1 = u1;

    x = _mm_mullo_epi32(u2, cospi32);
    y = _mm_mullo_epi32(u3, cospi32);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    v3 = _mm_sub_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    v4 = u4;
    v5 = u5;

    x = _mm_mullo_epi32(u6, cospi32);
    y = _mm_mullo_epi32(u7, cospi32);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    v7 = _mm_sub_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 3
    u0 = _mm_add_epi32(v0, v2);
    u1 = _mm_add_epi32(v1, v3);
    u2 = _mm_sub_epi32(v0, v2);
    u3 = _mm_sub_epi32(v1, v3);
    u4 = _mm_add_epi32(v4, v6);
    u5 = _mm_add_epi32(v5, v7);
    u6 = _mm_sub_epi32(v4, v6);
    u7 = _mm_sub_epi32(v5, v7);

    // stage 4
    v0 = u0;
    v1 = u1;
    v2 = u2;
    v3 = u3;

    x = _mm_mullo_epi32(u4, cospi16);
    y = _mm_mullo_epi32(u5, cospi48);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi48);
    y = _mm_mullo_epi32(u5, cospim16);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospim48);
    y = _mm_mullo_epi32(u7, cospi16);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi16);
    y = _mm_mullo_epi32(u7, cospi48);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 5
    u0 = _mm_add_epi32(v0, v4);
    u1 = _mm_add_epi32(v1, v5);
    u2 = _mm_add_epi32(v2, v6);
    u3 = _mm_add_epi32(v3, v7);
    u4 = _mm_sub_epi32(v0, v4);
    u5 = _mm_sub_epi32(v1, v5);
    u6 = _mm_sub_epi32(v2, v6);
    u7 = _mm_sub_epi32(v3, v7);

    // stage 6
    x = _mm_mullo_epi32(u0, cospi4);
    y = _mm_mullo_epi32(u1, cospi60);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    x = _mm_mullo_epi32(u0, cospi60);
    y = _mm_mullo_epi32(u1, cospim4);
    v1 = _mm_add_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi20);
    y = _mm_mullo_epi32(u3, cospi44);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi44);
    y = _mm_mullo_epi32(u3, cospim20);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    x = _mm_mullo_epi32(u4, cospi36);
    y = _mm_mullo_epi32(u5, cospi28);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi28);
    y = _mm_mullo_epi32(u5, cospim36);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospi52);
    y = _mm_mullo_epi32(u7, cospi12);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi12);
    y = _mm_mullo_epi32(u7, cospim52);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 7
    out[col_num * 0 + col] = v1;
    out[col_num * 1 + col] = v6;
    out[col_num * 2 + col] = v3;
    out[col_num * 3 + col] = v4;
    out[col_num * 4 + col] = v5;
    out[col_num * 5 + col] = v2;
    out[col_num * 6 + col] = v7;
    out[col_num * 7 + col] = v0;
  }
}